

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O2

int ftp_compress_open(char *url,int rwmode,int *handle)

{
  FILE *__stream;
  int iVar1;
  uint uVar2;
  size_t sVar3;
  uint opt;
  int *sock_00;
  ulong uVar4;
  FILE *pFVar5;
  char *pcVar6;
  ulong uVar7;
  int sock;
  FILE *command;
  FILE *ftpfile;
  char errorstr [1200];
  
  closeftpfile = 0;
  closecommandfile = 0;
  closememfile = 0;
  closefdiskfile = 0;
  closediskfile = 0;
  if (rwmode == 0) {
    sVar3 = strlen(netoutfile);
    if ((int)sVar3 != 0) {
      iVar1 = _setjmp((__jmp_buf_tag *)env);
      if (iVar1 == 0) {
        signal(0xe,signal_handler);
        alarm(net_timeout);
        sock_00 = &sock;
        iVar1 = ftp_open_network(url,&ftpfile,&command,sock_00);
        __stream = ftpfile;
        opt = (uint)sock_00;
        if (iVar1 == 0) {
          closeftpfile = closeftpfile + 1;
          closecommandfile = closecommandfile + 1;
          uVar2 = fgetc((FILE *)ftpfile);
          ungetc((int)(char)uVar2,(FILE *)__stream);
          pcVar6 = strstr(url,".gz");
          if (((pcVar6 == (char *)0x0) && (pcVar6 = strstr(url,".Z"), (uVar2 & 0xff) != 0x1f)) &&
             (pcVar6 == (char *)0x0)) {
            url = "Can only compressed files here (ftp_compress_open)";
          }
          else {
            if (netoutfile[0] == '!') {
              uVar4 = 0;
              uVar7 = sVar3 & 0xffffffff;
              if ((int)sVar3 < 1) {
                uVar7 = uVar4;
              }
              for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
                netoutfile[uVar4] = netoutfile[uVar4 + 1];
              }
              file_remove(netoutfile);
              opt = (uint)uVar4;
            }
            iVar1 = file_create(netoutfile,handle);
            if (iVar1 == 0) {
              closediskfile = closediskfile + 1;
              do {
                alarm(net_timeout);
                pFVar5 = __stream;
                sVar3 = fread(errorstr,1,0x4b0,(FILE *)__stream);
                opt = (uint)pFVar5;
                if (sVar3 == 0) {
                  file_close(*handle);
                  closediskfile = closediskfile + -1;
                  fclose((FILE *)__stream);
                  closeftpfile = closeftpfile + -1;
                  fclose((FILE *)command);
                  NET_SendRaw(sock,"QUIT\r\n",6,opt);
                  closecommandfile = closecommandfile + -1;
                  diskfile = (FILE *)fopen(netoutfile,"r");
                  if ((FILE *)diskfile == (FILE *)0x0) {
                    ffpmsg("Unable to reopen disk file (ftp_compress_open)");
                    pcVar6 = netoutfile;
                    goto LAB_00136266;
                  }
                  closefdiskfile = closefdiskfile + 1;
                  iVar1 = mem_create(url,handle);
                  if (iVar1 != 0) {
                    pcVar6 = "Unable to create memory file (ftp_compress_open)";
                    goto LAB_00136329;
                  }
                  closememfile = closememfile + 1;
                  iVar1 = mem_uncompress2mem(url,diskfile,*handle);
                  fclose((FILE *)diskfile);
                  closefdiskfile = closefdiskfile + -1;
                  if (iVar1 == 0) {
                    signal(0xe,(__sighandler_t)0x0);
                    alarm(0);
                    iVar1 = mem_seek(*handle,0);
                    return iVar1;
                  }
                  url = "Error writing compressed memory file (ftp_compress_open)";
                  goto LAB_0013645a;
                }
                alarm(0);
                iVar1 = file_write(*handle,errorstr,sVar3);
              } while (iVar1 == 0);
              ffpmsg("Error writing file (ftp_compres_open)");
            }
            else {
              url = "Unable to create output file (ftp_compress_open)";
            }
            ffpmsg(url);
            url = netoutfile;
          }
        }
        else {
          alarm(0);
          pcVar6 = "Unable to open ftp file (ftp_compress_open)";
LAB_00136329:
          ffpmsg(pcVar6);
        }
      }
      else {
        ffpmsg("Timeout (ftp_compress_open)");
        opt = net_timeout;
        snprintf(errorstr,0x4b0,"Download timeout exceeded: %d seconds");
        ffpmsg(errorstr);
        url = "   Timeout may be adjusted with fits_set_timeout";
      }
LAB_0013645a:
      ffpmsg(url);
      alarm(0);
      if (closeftpfile != 0) {
        fclose((FILE *)ftpfile);
      }
      if (closecommandfile != 0) {
        fclose((FILE *)command);
        NET_SendRaw(sock,"QUIT\r\n",6,opt);
      }
      if (closefdiskfile != 0) {
        fclose((FILE *)diskfile);
      }
      if (closememfile != 0) {
        mem_close_free(*handle);
      }
      if (closediskfile != 0) {
        file_close(*handle);
      }
      signal(0xe,(__sighandler_t)0x0);
      return 0x68;
    }
    pcVar6 = "Output file not set, shouldn\'t have happened (ftp_compress_open)";
  }
  else {
    pcVar6 = "Compressed files must be r/o";
  }
LAB_00136266:
  ffpmsg(pcVar6);
  return 0x68;
}

Assistant:

int ftp_compress_open(char *url, int rwmode, int *handle)
{
  FILE *ftpfile;
  FILE *command;
  char errorstr[MAXLEN];
  char recbuf[MAXLEN];
  long len;
  int ii, flen, status;
  int sock;
  char firstchar;

  closeftpfile = 0;
  closecommandfile = 0;
  closememfile = 0;
  closefdiskfile = 0;
  closediskfile = 0;

  /* don't do r/w files */
  if (rwmode != 0) {
    ffpmsg("Compressed files must be r/o");
    return (FILE_NOT_OPENED);
  }
  
  /* Need to know where to write the output file */
  flen = strlen(netoutfile);
  if (!flen) 
    {
      ffpmsg(
	"Output file not set, shouldn't have happened (ftp_compress_open)");
      return (FILE_NOT_OPENED);
    }
  
  /* do the signal handler bits */
  if (setjmp(env) != 0) {
    /* feels like the second time */
    /* this means something bad happened */
    ffpmsg("Timeout (ftp_compress_open)");
    snprintf(errorstr, MAXLEN, "Download timeout exceeded: %d seconds",net_timeout);
    ffpmsg(errorstr);
    ffpmsg("   Timeout may be adjusted with fits_set_timeout");
    goto error;
  }
  
  signal(SIGALRM, signal_handler);
  
  /* Open the network connection to url, ftpfile is connected to the file 
     port, command is connected to port 21.  sock is for writing to port 21 */
  alarm(net_timeout);

  if ((status = ftp_open_network(url,&ftpfile,&command,&sock))) {
    alarm(0);
    ffpmsg("Unable to open ftp file (ftp_compress_open)");
    ffpmsg(url);
    goto error;
  }
  closeftpfile++;
  closecommandfile++;

  /* Now, what do we do with the file */
  firstchar = fgetc(ftpfile);
  ungetc(firstchar,ftpfile);

  if (strstr(url,".gz") || 
      strstr(url,".Z") ||
      ('\037' == firstchar)) {
  
    if (*netoutfile == '!')
    {
       /* user wants to clobber file, if it already exists */
       for (ii = 0; ii < flen; ii++)
          netoutfile[ii] = netoutfile[ii + 1];  /* remove '!' */

       status = file_remove(netoutfile);
    }

    /* Create the output file */
    if ((status =  file_create(netoutfile,handle))) {
      ffpmsg("Unable to create output file (ftp_compress_open)");
      ffpmsg(netoutfile);
      goto error;
    }
    closediskfile++;
    
    /* write a file */
    alarm(net_timeout);
    while(0 != (len = fread(recbuf,1,MAXLEN,ftpfile))) {
      alarm(0);
      status = file_write(*handle,recbuf,len);
      if (status) {
	ffpmsg("Error writing file (ftp_compres_open)");
        ffpmsg(url);
        ffpmsg(netoutfile);
	goto error;
      }
      alarm(net_timeout);
    }

    file_close(*handle);
    closediskfile--;
    fclose(ftpfile);
    closeftpfile--;
    /* Close down the ftp connection */
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
    closecommandfile--;

    /* File is on disk, let's uncompress it into memory */

    if (NULL == (diskfile = fopen(netoutfile,"r"))) {
      ffpmsg("Unable to reopen disk file (ftp_compress_open)");
      ffpmsg(netoutfile);
      return (FILE_NOT_OPENED);
    }
    closefdiskfile++;
  
    if ((status =  mem_create(url,handle))) {
      ffpmsg("Unable to create memory file (ftp_compress_open)");
      ffpmsg(url);
      goto error;
    }
    closememfile++;

    status = 0;
    status = mem_uncompress2mem(url,diskfile,*handle);
    fclose(diskfile);
    closefdiskfile--;

    if (status) {
      ffpmsg("Error writing compressed memory file (ftp_compress_open)");
      goto error;
    }
      
  } else {
    /* Opps, this should not have happened */
    ffpmsg("Can only compressed files here (ftp_compress_open)");
    goto error;
  }    
    

  signal(SIGALRM, SIG_DFL);
  alarm(0);
  return mem_seek(*handle,0);

 error:
  alarm(0); /* clear it */
  if (closeftpfile) {
    fclose(ftpfile);
  }
  if (closecommandfile) {
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
  }
  if (closefdiskfile) {
    fclose(diskfile);
  }
  if (closememfile) {
    mem_close_free(*handle);
  }
  if (closediskfile) {
    file_close(*handle);
  } 
  
  signal(SIGALRM, SIG_DFL);
  return (FILE_NOT_OPENED);
}